

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void plain_array_suite::assign_iterator(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  ulong uVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  vector<int,_std::allocator<int>_> input;
  int array [4];
  allocator_type local_d1;
  vector<int,_std::allocator<int>_> local_d0;
  undefined8 *local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  int local_98 [8];
  circular_view<int,18446744073709551615ul> *local_78;
  size_type sStack_70;
  circular_view<int,18446744073709551615ul> *local_68;
  size_type sStack_60;
  circular_view<int,18446744073709551615ul> *local_58;
  size_type sStack_50;
  circular_view<int,18446744073709551615ul> *local_48;
  size_type sStack_40;
  circular_view<int,18446744073709551615ul> *local_38;
  size_type sStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_b8 = &local_28;
  local_28 = 0;
  uStack_20 = 0;
  local_b0 = 4;
  local_98[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l,&local_d1);
  local_a8 = 0;
  local_a0 = 4;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_b8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0xb;
  __l_00._M_len = 1;
  __l_00._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_00,&local_d1);
  uVar1 = local_b0 * 2;
  if ((uVar1 & local_b0 * 2 - 1) == 0) {
    uVar2 = local_a0 - local_a8 & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_a0;
  }
  else {
    uVar2 = (local_a0 - local_a8) % uVar1;
    sStack_30 = local_a0 % uVar1;
  }
  first_end.current = sStack_30;
  first_end.parent = (view_pointer)&local_b8;
  first_begin.current = uVar2;
  first_begin.parent = (view_pointer)&local_b8;
  local_38 = (circular_view<int,18446744073709551615ul> *)&local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x757,"void plain_array_suite::assign_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x15;
  local_98[1] = 0x16;
  __l_01._M_len = 2;
  __l_01._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_01,&local_d1);
  local_a8 = 0;
  local_a0 = local_b0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_b8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x15;
  local_98[1] = 0x16;
  __l_02._M_len = 2;
  __l_02._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_02,&local_d1);
  uVar1 = local_b0 * 2;
  if ((uVar1 & local_b0 * 2 - 1) == 0) {
    uVar2 = local_a0 - local_a8 & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_a0;
  }
  else {
    uVar2 = (local_a0 - local_a8) % uVar1;
    sStack_40 = local_a0 % uVar1;
  }
  first_end_00.current = sStack_40;
  first_end_00.parent = (view_pointer)&local_b8;
  first_begin_00.current = uVar2;
  first_begin_00.parent = (view_pointer)&local_b8;
  local_48 = (circular_view<int,18446744073709551615ul> *)&local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x760,"void plain_array_suite::assign_iterator()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x1f;
  local_98[1] = 0x20;
  local_98[2] = 0x21;
  __l_03._M_len = 3;
  __l_03._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_03,&local_d1);
  local_a8 = 0;
  local_a0 = local_b0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_b8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x1f;
  local_98[1] = 0x20;
  local_98[2] = 0x21;
  __l_04._M_len = 3;
  __l_04._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_04,&local_d1);
  uVar1 = local_b0 * 2;
  if ((uVar1 & local_b0 * 2 - 1) == 0) {
    uVar2 = local_a0 - local_a8 & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_a0;
  }
  else {
    uVar2 = (local_a0 - local_a8) % uVar1;
    sStack_50 = local_a0 % uVar1;
  }
  first_end_01.current = sStack_50;
  first_end_01.parent = (view_pointer)&local_b8;
  first_begin_01.current = uVar2;
  first_begin_01.parent = (view_pointer)&local_b8;
  local_58 = (circular_view<int,18446744073709551615ul> *)&local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x769,"void plain_array_suite::assign_iterator()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x29;
  local_98[1] = 0x2a;
  local_98[2] = 0x2b;
  local_98[3] = 0x2c;
  __l_05._M_len = 4;
  __l_05._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_05,&local_d1);
  local_a8 = 0;
  local_a0 = local_b0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_b8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x29;
  local_98[1] = 0x2a;
  local_98[2] = 0x2b;
  local_98[3] = 0x2c;
  __l_06._M_len = 4;
  __l_06._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_06,&local_d1);
  uVar1 = local_b0 * 2;
  if ((uVar1 & local_b0 * 2 - 1) == 0) {
    uVar2 = local_a0 - local_a8 & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_a0;
  }
  else {
    uVar2 = (local_a0 - local_a8) % uVar1;
    sStack_60 = local_a0 % uVar1;
  }
  first_end_02.current = sStack_60;
  first_end_02.parent = (view_pointer)&local_b8;
  first_begin_02.current = uVar2;
  first_begin_02.parent = (view_pointer)&local_b8;
  local_68 = (circular_view<int,18446744073709551615ul> *)&local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x772,"void plain_array_suite::assign_iterator()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x33;
  local_98[1] = 0x34;
  local_98[2] = 0x35;
  local_98[3] = 0x36;
  local_98[4] = 0x37;
  __l_07._M_len = 5;
  __l_07._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_07,&local_d1);
  local_a8 = 0;
  local_a0 = local_b0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_b8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98[0] = 0x34;
  local_98[1] = 0x35;
  local_98[2] = 0x36;
  local_98[3] = 0x37;
  __l_08._M_len = 4;
  __l_08._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l_08,&local_d1);
  uVar1 = local_b0 * 2;
  if ((uVar1 & local_b0 * 2 - 1) == 0) {
    uVar2 = local_a0 - local_a8 & uVar1 - 1;
    sStack_70 = uVar1 - 1 & local_a0;
  }
  else {
    uVar2 = (local_a0 - local_a8) % uVar1;
    sStack_70 = local_a0 % uVar1;
  }
  first_end_03.current = sStack_70;
  first_end_03.parent = (view_pointer)&local_b8;
  first_begin_03.current = uVar2;
  first_begin_03.parent = (view_pointer)&local_b8;
  local_78 = (circular_view<int,18446744073709551615ul> *)&local_b8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x77b,"void plain_array_suite::assign_iterator()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assign_iterator()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        std::vector<int> input = { 11 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 21, 22 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 21, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 31, 32, 33 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 31, 32, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 41, 42, 43, 44 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 41, 42, 43, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 51, 52, 53, 54, 55 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 52, 53, 54, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}